

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Engine.cpp
# Opt level: O2

void __thiscall adios2::core::Engine::Close(Engine *this,int transportIndex)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  (*this->_vptr_Engine[0x84])();
  this->m_IsOpen = false;
  if (transportIndex == -1) {
    std::operator+(&local_38,"freeing comm in Engine ",&this->m_Name);
    std::operator+(&bStack_58,&local_38,", in call to Close");
    helper::Comm::Free(&this->m_Comm,&bStack_58);
    std::__cxx11::string::~string((string *)&bStack_58);
    std::__cxx11::string::~string((string *)&local_38);
    this->m_IsClosed = true;
  }
  return;
}

Assistant:

void Engine::Close(const int transportIndex)
{
    DoClose(transportIndex);

    m_IsOpen = false;

    if (transportIndex == -1)
    {
        m_Comm.Free("freeing comm in Engine " + m_Name + ", in call to Close");
        m_IsClosed = true;
    }
}